

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa_minimization.cpp
# Opt level: O2

void __thiscall wasm::DFA::anon_unknown_0::Partitions::Partitions(Partitions *this,size_t size)

{
  allocator_type local_36;
  allocator_type local_35;
  allocator_type local_34;
  allocator_type local_33;
  allocator_type local_32;
  allocator_type local_31;
  
  this->sets = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&this->elements,size,&local_36)
  ;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&this->elementIndices,size,&local_35);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&this->setIndices,size,&local_34);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&this->beginnings,size,&local_33);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&this->endings,size,&local_32);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&this->pivots,size,&local_31);
  return;
}

Assistant:

Partitions(size_t size)
    : elements(size), elementIndices(size), setIndices(size), beginnings(size),
      endings(size), pivots(size) {}